

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<fasttext::Loss> __thiscall
fasttext::FastText::createLoss(FastText *this,shared_ptr<fasttext::Matrix> *output)

{
  element_type *peVar1;
  runtime_error *this_00;
  FastText *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<fasttext::Loss> sVar3;
  loss_name lossName;
  shared_ptr<fasttext::HierarchicalSoftmaxLoss> *in_stack_ffffffffffffff08;
  shared_ptr<fasttext::Loss> *in_stack_ffffffffffffff10;
  FastText *in_stack_ffffffffffffff18;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff20;
  int *this_01;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff38;
  shared_ptr<fasttext::Matrix> *__args;
  element_type *__args_00;
  shared_ptr<fasttext::Matrix> local_48 [2];
  loss_name local_1c;
  FastText *local_18;
  
  __args_00 = in_RDI;
  local_18 = in_RDX;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18262e);
  local_1c = peVar1->loss;
  switch(local_1c) {
  case hs:
    __args = local_48;
    getTargetCounts(in_stack_ffffffffffffff18);
    std::
    make_shared<fasttext::HierarchicalSoftmaxLoss,std::shared_ptr<fasttext::Matrix>&,std::vector<long,std::allocator<long>>>
              (__args,(vector<long,_std::allocator<long>_> *)local_18);
    std::shared_ptr<fasttext::Loss>::shared_ptr<fasttext::HierarchicalSoftmaxLoss,void>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::shared_ptr<fasttext::HierarchicalSoftmaxLoss>::~shared_ptr
              ((shared_ptr<fasttext::HierarchicalSoftmaxLoss> *)0x1826c2);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_ffffffffffffff20);
    _Var2._M_pi = extraout_RDX;
    break;
  case ns:
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x182711);
    this_01 = &peVar1->neg;
    getTargetCounts(local_18);
    std::
    make_shared<fasttext::NegativeSamplingLoss,std::shared_ptr<fasttext::Matrix>&,int&,std::vector<long,std::allocator<long>>>
              ((shared_ptr<fasttext::Matrix> *)__args_00,(int *)in_RDI,in_stack_ffffffffffffff38);
    std::shared_ptr<fasttext::Loss>::shared_ptr<fasttext::NegativeSamplingLoss,void>
              (in_stack_ffffffffffffff10,
               (shared_ptr<fasttext::NegativeSamplingLoss> *)in_stack_ffffffffffffff08);
    std::shared_ptr<fasttext::NegativeSamplingLoss>::~shared_ptr
              ((shared_ptr<fasttext::NegativeSamplingLoss> *)0x18276b);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)this_01);
    _Var2._M_pi = extraout_RDX_00;
    break;
  case softmax:
    std::make_shared<fasttext::SoftmaxLoss,std::shared_ptr<fasttext::Matrix>&>
              ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff38);
    std::shared_ptr<fasttext::Loss>::shared_ptr<fasttext::SoftmaxLoss,void>
              (in_stack_ffffffffffffff10,
               (shared_ptr<fasttext::SoftmaxLoss> *)in_stack_ffffffffffffff08);
    std::shared_ptr<fasttext::SoftmaxLoss>::~shared_ptr
              ((shared_ptr<fasttext::SoftmaxLoss> *)0x1827c8);
    _Var2._M_pi = extraout_RDX_01;
    break;
  case ova:
    std::make_shared<fasttext::OneVsAllLoss,std::shared_ptr<fasttext::Matrix>&>
              ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff38);
    std::shared_ptr<fasttext::Loss>::shared_ptr<fasttext::OneVsAllLoss,void>
              (in_stack_ffffffffffffff10,
               (shared_ptr<fasttext::OneVsAllLoss> *)in_stack_ffffffffffffff08);
    std::shared_ptr<fasttext::OneVsAllLoss>::~shared_ptr
              ((shared_ptr<fasttext::OneVsAllLoss> *)0x1827f8);
    _Var2._M_pi = extraout_RDX_02;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown loss");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __args_00;
  return (shared_ptr<fasttext::Loss>)
         sVar3.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Loss> FastText::createLoss(std::shared_ptr<Matrix>& output) {
  loss_name lossName = args_->loss;
  switch (lossName) {
    case loss_name::hs:
      return std::make_shared<HierarchicalSoftmaxLoss>(
          output, getTargetCounts());
    case loss_name::ns:
      return std::make_shared<NegativeSamplingLoss>(
          output, args_->neg, getTargetCounts());
    case loss_name::softmax:
      return std::make_shared<SoftmaxLoss>(output);
    case loss_name::ova:
      return std::make_shared<OneVsAllLoss>(output);
    default:
      throw std::runtime_error("Unknown loss");
  }
}